

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matcher.h
# Opt level: O2

vector<unsigned_long,_std::allocator<unsigned_long>_> * __thiscall
cpsm::Matcher<cpsm::PlatformPathTraits,_cpsm::SimpleStringTraits>::match_positions
          (vector<unsigned_long,_std::allocator<unsigned_long>_> *__return_storage_ptr__,
          Matcher<cpsm::PlatformPathTraits,_cpsm::SimpleStringTraits> *this)

{
  (__return_storage_ptr__->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  if (this->prefix_level_ == NONE) {
    get_match_positions_sorted_no_prefix(this,__return_storage_ptr__);
  }
  else {
    get_match_positions_component_prefix_dirpath(this,__return_storage_ptr__);
    if (this->prefix_level_ == BASENAME_WORD) {
      get_match_positions_basename_word_prefix(this,__return_storage_ptr__);
    }
    else {
      get_match_positions_basename_non_word_prefix(this,__return_storage_ptr__);
    }
    std::
    __sort<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,__gnu_cxx::__ops::_Iter_less_iter>
              ((__return_storage_ptr__->
               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
               super__Vector_impl_data._M_start,
               (__return_storage_ptr__->
               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
               super__Vector_impl_data._M_finish);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<std::size_t> match_positions() const final {
    std::vector<std::size_t> posns;
    if (prefix_level_ == PrefixLevel::NONE) {
      get_match_positions_sorted_no_prefix(posns);
      return posns;
    }
    get_match_positions_component_prefix_dirpath(posns);
    if (prefix_level_ == PrefixLevel::BASENAME_WORD) {
      get_match_positions_basename_word_prefix(posns);
    } else {
      get_match_positions_basename_non_word_prefix(posns);
    }
    std::sort(posns.begin(), posns.end());
    return posns;
  }